

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 propagateFloatx80NaNOneArg(floatx80 a,float_status *status)

{
  int iVar1;
  ulong uVar2;
  floatx80 fVar3;
  floatx80 fVar4;
  
  fVar3.low = a.low;
  uVar2 = a._8_8_ & 0xffffffff;
  iVar1 = floatx80_is_signaling_nan_m68k(a,status);
  if (iVar1 != 0) {
    float_raise_m68k('\x01',status);
    fVar3._8_8_ = a._8_8_ & 0xffffffff;
    fVar3 = floatx80_silence_nan_m68k(fVar3,status);
    uVar2 = (ulong)fVar3._8_4_;
  }
  if (status->default_nan_mode != '\0') {
    fVar3 = floatx80_default_nan_m68k(status);
    uVar2 = (ulong)fVar3._8_4_;
  }
  fVar4._8_8_ = uVar2;
  fVar4.low = fVar3.low;
  return fVar4;
}

Assistant:

static floatx80 propagateFloatx80NaNOneArg(floatx80 a, float_status *status)
{
    if (floatx80_is_signaling_nan(a, status)) {
        float_raise(float_flag_invalid, status);
        a = floatx80_silence_nan(a, status);
    }

    if (status->default_nan_mode) {
        return floatx80_default_nan(status);
    }

    return a;
}